

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

FExecList * C_ParseExecFile(char *file,FExecList *exec)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  undefined8 uStack_1040;
  char cmd [4096];
  
  uStack_1040 = 0x42c0d0;
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    uStack_1040 = 0x42c1cf;
    Printf("Could not open \"%s\"\n",file);
  }
  else {
LAB_0042c0e6:
    uStack_1040 = 0x42c0f6;
    pcVar6 = fgets(cmd,0xfff,__stream);
    if (pcVar6 != (char *)0x0) {
      uStack_1040 = 0x42c107;
      sVar7 = strlen(cmd);
      if (cmd[sVar7 - 1] == '\n') {
        cmd[sVar7 - 1] = '\0';
        lVar2 = (long)&uStack_1040 + 6;
      }
      else {
        lVar2 = (long)&uStack_1040 + 7;
      }
      bVar3 = false;
      for (lVar8 = 0; cmd + lVar8 < (char *)(lVar2 + sVar7); lVar8 = lVar8 + 1) {
        cVar1 = cmd[lVar8];
        if (cVar1 == '\"') {
          bVar3 = (bool)(bVar3 ^ 1);
        }
        else {
          bVar4 = !bVar3;
          bVar3 = true;
          if (bVar4) {
            bVar3 = false;
            if ((cVar1 == '/') && (bVar3 = false, cmd[lVar8 + 1] == '/')) {
              if (lVar8 == 0) goto LAB_0042c0e6;
              cmd[lVar8] = '\0';
              goto LAB_0042c15b;
            }
          }
        }
      }
      if (lVar8 != 0) {
LAB_0042c15b:
        if (exec == (FExecList *)0x0) {
          uStack_1040 = 0x42c168;
          exec = (FExecList *)operator_new(0x20);
          (exec->Commands).Array = (FString *)0x0;
          (exec->Commands).Most = 0;
          (exec->Commands).Count = 0;
          (exec->Pullins).Array = (FString *)0x0;
          (exec->Pullins).Most = 0;
          (exec->Pullins).Count = 0;
        }
        uStack_1040 = 0x42c183;
        FExecList::AddCommand(exec,cmd,file);
      }
      goto LAB_0042c0e6;
    }
    uStack_1040 = 0x42c19f;
    iVar5 = feof(__stream);
    if (iVar5 == 0) {
      uStack_1040 = 0x42c1b4;
      Printf("Error parsing \"%s\"\n",file);
    }
    uStack_1040 = 0x42c1bc;
    fclose(__stream);
  }
  return exec;
}

Assistant:

FExecList *C_ParseExecFile(const char *file, FExecList *exec)
{
	FILE *f;
	char cmd[4096];
	int retval = 0;

	if ( (f = fopen (file, "r")) )
	{
		while (fgets(cmd, countof(cmd)-1, f))
		{
			// Comments begin with //
			char *stop = cmd + strlen(cmd) - 1;
			char *comment = cmd;
			int inQuote = 0;

			if (*stop == '\n')
				*stop-- = 0;

			while (comment < stop)
			{
				if (*comment == '\"')
				{
					inQuote ^= 1;
				}
				else if (!inQuote && *comment == '/' && *(comment + 1) == '/')
				{
					break;
				}
				comment++;
			}
			if (comment == cmd)
			{ // Comment at line beginning
				continue;
			}
			else if (comment < stop)
			{ // Comment in middle of line
				*comment = 0;
			}
			if (exec == NULL)
			{
				exec = new FExecList;
			}
			exec->AddCommand(cmd, file);
		}
		if (!feof(f))
		{
			Printf("Error parsing \"%s\"\n", file);
		}
		fclose(f);
	}
	else
	{
		Printf ("Could not open \"%s\"\n", file);
	}
	return exec;
}